

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeMassMatrixAndGravityForce(ChElementBeamANCF_3333 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double xi;
  double eta;
  double zeta;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double *pdVar6;
  Index j;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 *puVar11;
  ulong uVar12;
  double dVar13;
  VectorN Sxi_compact;
  type tmp;
  ChMatrixNM<double,_NSF,_NSF>_conflict1 MassMatrixCompactSquare;
  VectorN local_588;
  double local_540 [9];
  double adStack_4f8 [9];
  double adStack_4b0 [9];
  double adStack_468 [9];
  double adStack_420 [9];
  double adStack_3d8 [9];
  double adStack_390 [9];
  double adStack_348 [9];
  double adStack_300 [9];
  undefined1 local_2b8 [64];
  double local_278 [73];
  
  memset(local_2b8,0,0x288);
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[8] = 0.0;
  peVar5 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar1 = peVar5->m_rho;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(long *)(DAT_00b92cb0 + 0x68) != *(long *)(DAT_00b92cb0 + 0x60)) {
    uVar8 = 0;
    do {
      if (*(long *)(DAT_00b92cb0 + 0x20) != *(long *)(DAT_00b92cb0 + 0x18)) {
        uVar9 = 0;
        do {
          lVar7 = *(long *)(DAT_00b92cb0 + 0x18);
          if (*(long *)(DAT_00b92cb0 + 0x20) != lVar7) {
            uVar12 = 0;
            do {
              dVar2 = *(double *)(*(long *)(static_tables_3333 + 0x60) + uVar8 * 8);
              dVar3 = *(double *)(*(long *)(static_tables_3333 + 0x18) + uVar9 * 8);
              dVar4 = *(double *)(*(long *)(static_tables_3333 + 0x18) + uVar12 * 8);
              xi = *(double *)(*(long *)(DAT_00b92cb0 + 0x60) + uVar8 * 8);
              eta = *(double *)(lVar7 + uVar9 * 8);
              zeta = *(double *)(lVar7 + uVar12 * 8);
              dVar13 = Calc_det_J_0xi(this,xi,eta,zeta);
              Calc_Sxi_compact(this,&local_588,xi,eta,zeta);
              dVar13 = dVar13 * dVar2 * dVar3 * dVar4 * dVar1;
              dVar2 = (this->m_GravForceScale).
                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                      array[1];
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
              m_storage.m_data.array[0] =
                   dVar13 * local_588.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                            m_storage.m_data.array[0] +
                   (this->m_GravForceScale).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array[0];
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
              m_storage.m_data.array[1] =
                   dVar13 * local_588.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                            m_storage.m_data.array[1] + dVar2;
              dVar2 = (this->m_GravForceScale).
                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                      array[3];
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
              m_storage.m_data.array[2] =
                   dVar13 * local_588.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                            m_storage.m_data.array[2] +
                   (this->m_GravForceScale).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array[2];
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
              m_storage.m_data.array[3] =
                   dVar13 * local_588.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                            m_storage.m_data.array[3] + dVar2;
              dVar2 = (this->m_GravForceScale).
                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                      array[5];
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
              m_storage.m_data.array[4] =
                   dVar13 * local_588.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                            m_storage.m_data.array[4] +
                   (this->m_GravForceScale).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array[4];
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
              m_storage.m_data.array[5] =
                   dVar13 * local_588.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                            m_storage.m_data.array[5] + dVar2;
              dVar2 = (this->m_GravForceScale).
                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                      array[7];
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
              m_storage.m_data.array[6] =
                   dVar13 * local_588.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                            m_storage.m_data.array[6] +
                   (this->m_GravForceScale).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array[6];
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
              m_storage.m_data.array[7] =
                   dVar13 * local_588.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                            m_storage.m_data.array[7] + dVar2;
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
              m_storage.m_data.array[8] =
                   dVar13 * local_588.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                            m_storage.m_data.array[8] +
                   (this->m_GravForceScale).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array[8];
              pdVar6 = local_540 + 8;
              lVar7 = 0;
              do {
                dVar2 = local_588.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                        m_storage.m_data.array[lVar7];
                pdVar6[-8] = dVar13 * local_588.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                      m_storage.m_data.array[0] * dVar2;
                pdVar6[-7] = dVar13 * local_588.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                      m_storage.m_data.array[1] * dVar2;
                pdVar6[-6] = dVar13 * local_588.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                      m_storage.m_data.array[2] * dVar2;
                pdVar6[-5] = dVar13 * local_588.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                      m_storage.m_data.array[3] * dVar2;
                pdVar6[-4] = dVar13 * local_588.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                      m_storage.m_data.array[4] * dVar2;
                pdVar6[-3] = dVar13 * local_588.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                      m_storage.m_data.array[5] * dVar2;
                pdVar6[-2] = dVar13 * local_588.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                      m_storage.m_data.array[6] * dVar2;
                pdVar6[-1] = dVar13 * local_588.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                      m_storage.m_data.array[7] * dVar2;
                *pdVar6 = dVar13 * local_588.
                                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                   m_storage.m_data.array[8] * dVar2;
                lVar7 = lVar7 + 1;
                pdVar6 = pdVar6 + 9;
              } while (lVar7 != 9);
              pdVar6 = local_278;
              lVar7 = 0;
              do {
                pdVar6[-8] = local_540[lVar7] + pdVar6[-8];
                pdVar6[-7] = adStack_4f8[lVar7] + pdVar6[-7];
                pdVar6[-6] = adStack_4b0[lVar7] + pdVar6[-6];
                pdVar6[-5] = adStack_468[lVar7] + pdVar6[-5];
                pdVar6[-4] = adStack_420[lVar7] + pdVar6[-4];
                pdVar6[-3] = adStack_3d8[lVar7] + pdVar6[-3];
                pdVar6[-2] = adStack_390[lVar7] + pdVar6[-2];
                pdVar6[-1] = adStack_348[lVar7] + pdVar6[-1];
                *pdVar6 = adStack_300[lVar7] + *pdVar6;
                lVar7 = lVar7 + 1;
                pdVar6 = pdVar6 + 9;
              } while (lVar7 != 9);
              uVar12 = (ulong)((int)uVar12 + 1);
              lVar7 = *(long *)(DAT_00b92cb0 + 0x18);
            } while (uVar12 < (ulong)(*(long *)(DAT_00b92cb0 + 0x20) - lVar7 >> 3));
          }
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (uVar9 < (ulong)(*(long *)(DAT_00b92cb0 + 0x20) - *(long *)(DAT_00b92cb0 + 0x18) >>
                                3));
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 < (ulong)(*(long *)(DAT_00b92cb0 + 0x68) - *(long *)(DAT_00b92cb0 + 0x60) >> 3));
  }
  lVar7 = 0;
  uVar8 = 0;
  puVar11 = local_2b8;
  do {
    uVar9 = uVar8;
    if ((uint)uVar8 < 0x2e) {
      uVar9 = 0x2d;
    }
    lVar10 = 0;
    do {
      if (uVar9 - uVar8 == lVar10) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 45, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 45, 1>, Level = 1]"
                     );
      }
      (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
      m_data.array[uVar8 + lVar10] = *(double *)(puVar11 + lVar10 * 8);
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 + (int)lVar7 != 9);
    lVar7 = lVar7 + 1;
    puVar11 = puVar11 + 0x50;
    uVar8 = (ulong)((uint)uVar8 + (int)lVar10);
  } while (lVar7 != 9);
  return;
}

Assistant:

void ChElementBeamANCF_3333::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 9 in xi, 3 in eta, and 3 in zeta.
    // 4 GQ Points are needed in the xi direction and 2 GQ Points are needed in the eta and zeta directions for
    // exact integration of the element's mass matrix, even if the reference configuration is not straight. Since the
    // major pieces of the generalized force due to gravity can also be used to calculate the mass matrix, these
    // calculations are performed at the same time.  Only the matrix that scales the acceleration due to gravity is
    // calculated at this time so that any changes to the acceleration due to gravity in the system are correctly
    // accounted for in the generalized internal force calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = 4;        // 5 Point Gauss-Quadrature;
    unsigned int GQ_idx_eta_zeta = 1;  // 2 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    double rho = GetMaterial()->Get_rho();  // Density of the material for the element

    // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];
                double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta);  // determinant of the element Jacobian (volume ratio)

                VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);

                m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}